

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double half_normal_pdf(double x,double a,double b)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (a < x) {
    dVar1 = (x - a) / b;
    dVar1 = exp(dVar1 * -0.5 * dVar1);
    dVar1 = dVar1 * (1.0 / b) * 0.7978845608028654;
  }
  return dVar1;
}

Assistant:

double half_normal_pdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    HALF_NORMAL_PDF evaluates the Half Normal PDF.
//
//  Discussion:
//
//    PDF(A,B;X) =
//      sqrt ( 2 / PI ) * ( 1 / B ) * exp ( - 0.5 * ( ( X - A ) / B )^2 )
//
//    for A <= X
//
//    The Half Normal PDF is a special case of both the Chi PDF and the
//    Folded Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//    A <= X
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < B.
//
//    Output, double HALF_NORMAL_PDF, the value of the PDF.
//
{
  double pdf;
  const double r8_pi = 3.14159265358979323;
  double y;

  if ( x <= a )
  {
    pdf = 0.0;
  }
  else
  {
    y = ( x - a ) / b;

    pdf = sqrt ( 2.0 / r8_pi ) * ( 1.0 / b ) * exp ( - 0.5 * y * y );

  }

  return pdf;
}